

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

char * FIX::integer_to_string<int>(char *buf,size_t len,int t)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  long lStack_8;
  
  uVar2 = (ulong)(uint)-t;
  if (0 < t) {
    uVar2 = (ulong)(uint)t;
  }
  pcVar3 = buf + (len - 1);
  for (; 99 < (uint)uVar2; uVar2 = uVar2 / 100) {
    *(undefined2 *)(pcVar3 + -1) = *(undefined2 *)(digit_pairs + (uVar2 % 100) * 2);
    pcVar3 = pcVar3 + -2;
  }
  if ((uint)uVar2 < 10) {
    bVar1 = (byte)uVar2 | 0x30;
    lStack_8 = -1;
  }
  else {
    *pcVar3 = digit_pairs[(uVar2 * 2 & 0xffffffff) + 1];
    bVar1 = digit_pairs[uVar2 * 2];
    lStack_8 = -2;
  }
  pcVar3[lStack_8 + 1] = bVar1;
  if (-1 < t) {
    return pcVar3 + lStack_8 + 1;
  }
  pcVar3[lStack_8] = '-';
  return pcVar3 + lStack_8;
}

Assistant:

inline char *integer_to_string(char *buf, const size_t len, const T t) {
  const bool isNegative = t < 0;
  char *p = buf + len;

  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(t);

  while (number > 99) {
    unsigned_int pos = number % 100;
    number /= 100;

    *--p = digit_pairs[2 * pos + 1];
    *--p = digit_pairs[2 * pos];
  }

  if (number > 9) {
    *--p = digit_pairs[2 * number + 1];
    *--p = digit_pairs[2 * number];
  } else {
    *--p = '0' + char(number);
  }

  if (isNegative) {
    *--p = '-';
  }

  return p;
}